

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::AggregationPS::execute
          (AggregationPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  VarStatus VVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  double *pdVar6;
  VarStatus *pVVar7;
  char *pcVar8;
  ostream *this_00;
  SPxInternalCodeException *this_01;
  int __c;
  int __c_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar10;
  double dVar11;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000008;
  byte in_stack_00000010;
  int k_1;
  double dualVal;
  double z;
  double scale;
  int k;
  int active_idx;
  double aij;
  double val;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  VectorBase<double> *in_stack_fffffffffffffe60;
  SVectorBase<double> *in_stack_fffffffffffffe68;
  allocator *paVar12;
  Real in_stack_fffffffffffffe70;
  allocator local_91;
  string local_90 [36];
  uint local_6c;
  double local_68;
  double local_60;
  double local_58;
  uint local_50;
  int local_4c;
  double local_48;
  double local_40;
  byte local_31;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *local_30;
  
  local_31 = in_stack_00000010 & 1;
  local_30 = in_R9;
  if (*(int *)((long)in_RDI + 0x2c) != *(int *)((long)in_RDI + 0x34)) {
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar10 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    *pdVar6 = dVar10;
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar10 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    *pdVar6 = dVar10;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
    VVar2 = *pVVar7;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)((long)in_RDI + 0x34));
    *pVVar7 = VVar2;
  }
  if ((int)in_RDI[5] != (int)in_RDI[6]) {
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar10 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    *pdVar6 = dVar10;
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar10 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    *pdVar6 = dVar10;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[5]);
    VVar2 = *pVVar7;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[6]);
    *pVVar7 = VVar2;
  }
  local_40 = 0.0;
  local_48 = SVectorBase<double>::operator[]
                       (in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  local_4c = -1;
  uVar9 = extraout_RDX;
  for (local_50 = 0; (int)local_50 < 2; local_50 = local_50 + 1) {
    pcVar8 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0xe),(char *)(ulong)local_50,(int)uVar9);
    uVar9 = extraout_RDX_00;
    if ((int)pcVar8 != (int)in_RDI[5]) {
      pcVar8 = SVectorBase<double>::index
                         ((SVectorBase<double> *)(in_RDI + 0xe),(char *)(ulong)local_50,
                          (int)extraout_RDX_00);
      local_4c = (int)pcVar8;
      pdVar6 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0xe),local_50);
      dVar10 = *pdVar6;
      pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      local_40 = dVar10 * *pdVar6;
      uVar9 = extraout_RDX_01;
    }
  }
  local_58 = maxAbs(in_stack_fffffffffffffe70,(Real)in_stack_fffffffffffffe68);
  if (local_58 < 1.0) {
    local_58 = 1.0;
  }
  local_60 = (double)in_RDI[0xc] / local_58 - local_40 / local_58;
  (**(code **)(*in_RDI + 0x38))();
  bVar4 = isZero<double,double>
                    ((double)in_stack_fffffffffffffe60,
                     (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (bVar4) {
    local_60 = 0.0;
  }
  dVar10 = (local_60 * local_58) / local_48;
  pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  *pdVar6 = dVar10;
  dVar10 = (double)in_RDI[0xc];
  pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  *pdVar6 = dVar10;
  if ((local_31 & 1) != 0) {
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar10 = *pdVar6;
    dVar1 = (double)in_RDI[8];
    dVar11 = (double)(**(code **)(*in_RDI + 0x30))();
    bVar4 = LT<double,double,double>(dVar10,dVar1,dVar11);
    if (!bVar4) {
      pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar10 = *pdVar6;
      dVar1 = (double)in_RDI[7];
      dVar11 = (double)(**(code **)(*in_RDI + 0x30))();
      bVar4 = GT<double,double,double>(dVar10,dVar1,dVar11);
      if (!bVar4) goto LAB_00285f1b;
    }
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "EMAISM: numerical violation after disaggregating variable");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
LAB_00285f1b:
  local_68 = 0.0;
  for (local_6c = 0; uVar3 = local_6c,
      iVar5 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 0x12)), (int)uVar3 < iVar5;
      local_6c = local_6c + 1) {
    pcVar8 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0x12),(char *)(ulong)local_6c,__c);
    if ((int)pcVar8 != *(int *)((long)in_RDI + 0x2c)) {
      pdVar6 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x12),local_6c);
      dVar10 = *pdVar6;
      SVectorBase<double>::index
                ((SVectorBase<double> *)(in_RDI + 0x12),(char *)(ulong)local_6c,__c_00);
      pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      local_68 = dVar10 * *pdVar6 + local_68;
    }
  }
  local_60 = (double)in_RDI[9] - local_68;
  dVar10 = local_60 / local_48;
  pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  *pdVar6 = dVar10;
  pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  *pdVar6 = 0.0;
  pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_30,local_4c);
  if ((*pVVar7 == ON_UPPER) ||
     (pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_30,local_4c),
     *pVVar7 == FIXED)) {
    VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    (**(code **)(*in_RDI + 0x30))();
    bVar4 = NE<double,double,double>
                      ((double)in_stack_fffffffffffffe60,
                       (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       1.3074449304584e-317);
    if (!bVar4) goto LAB_00286122;
LAB_002861ac:
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_30,local_4c);
    *pVVar7 = BASIC;
    pdVar6 = VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    *pdVar6 = 0.0;
    VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    (**(code **)(*in_RDI + 0x30))();
    bVar4 = EQ<double,double,double>
                      ((double)in_stack_fffffffffffffe60,
                       (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       1.30758376290488e-317);
    if (bVar4) {
      pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,(int)in_RDI[5]);
      *pVVar7 = ON_UPPER;
    }
    else {
      VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      (**(code **)(*in_RDI + 0x30))();
      bVar4 = EQ<double,double,double>
                        ((double)in_stack_fffffffffffffe60,
                         (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                         1.30764305078238e-317);
      if (!bVar4) {
        dVar10 = (double)in_RDI[7];
        pdVar6 = (double *)infinity();
        if (*pdVar6 <= dVar10) {
          dVar10 = (double)in_RDI[8];
          pdVar6 = (double *)infinity();
          if (dVar10 <= -*pdVar6) {
            pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                               (local_30,(int)in_RDI[5]);
            *pVVar7 = ZERO;
            goto LAB_00286457;
          }
        }
        this_01 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        paVar12 = &local_91;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_90,"XMAISM unexpected basis status in aggregation unsimplifier.",paVar12);
        SPxInternalCodeException::SPxInternalCodeException
                  (this_01,(string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        __cxa_throw(this_01,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      }
      pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (local_30,(int)in_RDI[5]);
      *pVVar7 = ON_LOWER;
    }
  }
  else {
LAB_00286122:
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_30,local_4c);
    if ((*pVVar7 == ON_LOWER) ||
       (pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](local_30,local_4c),
       *pVVar7 == FIXED)) {
      VectorBase<double>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      (**(code **)(*in_RDI + 0x30))();
      bVar4 = NE<double,double,double>
                        ((double)in_stack_fffffffffffffe60,
                         (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                         1.30751261745188e-317);
      if (bVar4) goto LAB_002861ac;
    }
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (local_30,(int)in_RDI[5]);
    *pVVar7 = BASIC;
  }
LAB_00286457:
  pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                     (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
  *pVVar7 = ON_UPPER;
  return;
}

Assistant:

void SPxMainSM<R>::AggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];
   int active_idx = -1;

   assert(m_row.size() == 2);

   for(int k = 0; k < 2; ++k)
   {
      if(m_row.index(k) != m_j)
      {
         active_idx = m_row.index(k);
         val = m_row.value(k) * x[active_idx];
      }
   }

   assert(active_idx >= 0);

   R scale = maxAbs(m_rhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_rhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_rhs;

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
   {
      SPX_MSG_ERROR(std::cerr << "EMAISM: numerical violation after disaggregating variable" << std::endl;
                   )
   }

   // dual:
   R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   if(((cStatus[active_idx] == SPxSolverBase<R>::ON_UPPER
         || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
         && NE(x[active_idx], m_oldupper, this->feastol())) ||
         ((cStatus[active_idx] == SPxSolverBase<R>::ON_LOWER
           || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
          && NE(x[active_idx], m_oldlower, this->feastol())))
   {
      cStatus[active_idx] = SPxSolverBase<R>::BASIC;
      r[active_idx] = 0.0;
      assert(NE(m_upper, m_lower, this->epsilon()));

      if(EQ(x[m_j], m_upper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(EQ(x[m_j], m_lower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(m_upper >= R(infinity) && m_lower <= R(-infinity))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM unexpected basis status in aggregation unsimplifier.");
   }
   else
   {
      cStatus[m_j] = SPxSolverBase<R>::BASIC;
   }

   // sides may not be equal and we always only consider the rhs during aggregation, so set ON_UPPER
   // (in theory and with exact arithmetic setting it to FIXED would be correct)
   rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}